

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  uint uVar11;
  ulong uVar12;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar13;
  value_type vVar14;
  
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar9 = (pFVar13->fadexpr_).left_;
  pFVar10 = (pFVar9->fadexpr_).right_;
  uVar11 = (pFVar10->dx_).num_elts;
  uVar3 = (((pFVar13->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar11) {
    uVar3 = uVar11;
  }
  uVar4 = (this->dx_).num_elts;
  if (uVar3 == uVar4) {
    if (uVar3 == 0) goto LAB_00f770f3;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar3 == 0) {
      if (uVar4 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f770f3;
    }
    if (uVar4 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar13 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar3;
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar12 = (ulong)uVar3 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar12);
    (this->dx_).ptr_to_data = pdVar8;
    pFVar9 = (pFVar13->fadexpr_).left_;
    pFVar10 = (pFVar9->fadexpr_).right_;
    uVar11 = (pFVar10->dx_).num_elts;
  }
  if ((uVar11 == 0) || (pFVar5 = (pFVar13->fadexpr_).right_, (pFVar5->dx_).num_elts == 0)) {
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        vVar14 = FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::
                 dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar12);
        pdVar8[uVar12] = vVar14;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
  }
  else if (0 < (int)uVar3) {
    pdVar6 = (pFVar10->dx_).ptr_to_data;
    pdVar7 = (pFVar5->dx_).ptr_to_data;
    uVar12 = 0;
    do {
      dVar1 = (pFVar9->fadexpr_).left_.constant_;
      dVar2 = pFVar10->val_;
      pdVar8[uVar12] =
           (dVar1 / dVar2) * pdVar7[uVar12] -
           ((pdVar6[uVar12] * dVar1) / (dVar2 * dVar2)) * pFVar5->val_;
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
LAB_00f770f3:
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar9 = (pFVar13->fadexpr_).left_;
  this->val_ = ((pFVar9->fadexpr_).left_.constant_ / ((pFVar9->fadexpr_).right_)->val_) *
               ((pFVar13->fadexpr_).right_)->val_ + (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}